

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<signed_char,signed_char,signed_char,duckdb::BinaryStandardOperatorWrapper,duckdb::ModuloOperator,bool,true,false>
               (char *ldata,char *rdata,char *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  char cVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      cVar4 = *ldata;
      iVar7 = 0;
      do {
        cVar3 = cVar4 >> 7;
        result_data[iVar7] =
             (char)(CONCAT22(CONCAT11(cVar3,cVar3),(short)cVar4) % (int)(short)rdata[iVar7]);
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar10 = 0;
    do {
      uVar2 = puVar1[uVar5];
      uVar8 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar8 = count;
      }
      uVar9 = uVar8;
      if (uVar2 != 0) {
        uVar9 = uVar10;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar10 < uVar8) {
            cVar4 = *ldata;
            do {
              cVar3 = cVar4 >> 7;
              result_data[uVar10] =
                   (char)(CONCAT22(CONCAT11(cVar3,cVar3),(short)cVar4) % (int)(short)rdata[uVar10]);
              uVar10 = uVar10 + 1;
              uVar9 = uVar8;
            } while (uVar8 != uVar10);
          }
        }
        else if (uVar10 < uVar8) {
          uVar6 = 0;
          do {
            if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
              cVar4 = *ldata >> 7;
              result_data[uVar6 + uVar10] =
                   (char)(CONCAT22(CONCAT11(cVar4,cVar4),(short)*ldata) %
                         (int)(short)rdata[uVar6 + uVar10]);
            }
            uVar6 = uVar6 + 1;
            uVar9 = uVar8;
          } while (uVar8 - uVar10 != uVar6);
        }
      }
      uVar5 = uVar5 + 1;
      uVar10 = uVar9;
    } while (uVar5 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}